

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmCommonTargetGenerator::AddModuleDefinitionFlag(cmCommonTargetGenerator *this,string *flags)

{
  cmMakefile *this_00;
  cmLocalCommonGenerator *pcVar1;
  char *pcVar2;
  string *psVar3;
  string local_a0 [39];
  allocator local_79;
  string local_78 [8];
  string flag;
  allocator local_41;
  string local_40;
  char *local_20;
  char *defFileFlag;
  string *flags_local;
  cmCommonTargetGenerator *this_local;
  
  if (this->ModuleDefinitionFile != (cmSourceFile *)0x0) {
    this_00 = this->Makefile;
    defFileFlag = (char *)flags;
    flags_local = (string *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"CMAKE_LINK_DEF_FILE_FLAG",&local_41);
    pcVar2 = cmMakefile::GetDefinition(this_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (pcVar2 != (char *)0x0) {
      local_20 = pcVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,pcVar2,&local_79);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      pcVar1 = this->LocalGenerator;
      psVar3 = cmSourceFile::GetFullPath_abi_cxx11_(this->ModuleDefinitionFile);
      (*(pcVar1->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xd])(local_a0,pcVar1,psVar3,2);
      std::__cxx11::string::operator+=(local_78,local_a0);
      std::__cxx11::string::~string(local_a0);
      (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[5])
                (this->LocalGenerator,defFileFlag,local_78);
      std::__cxx11::string::~string(local_78);
    }
  }
  return;
}

Assistant:

void cmCommonTargetGenerator::AddModuleDefinitionFlag(std::string& flags)
{
  if(!this->ModuleDefinitionFile)
    {
    return;
    }

  // TODO: Create a per-language flag variable.
  const char* defFileFlag =
    this->Makefile->GetDefinition("CMAKE_LINK_DEF_FILE_FLAG");
  if(!defFileFlag)
    {
    return;
    }

  // Append the flag and value.  Use ConvertToLinkReference to help
  // vs6's "cl -link" pass it to the linker.
  std::string flag = defFileFlag;
  flag += (this->LocalGenerator->ConvertToLinkReference(
             this->ModuleDefinitionFile->GetFullPath()));
  this->LocalGenerator->AppendFlags(flags, flag);
}